

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O1

int fld_eq(limb_t *a,limb_t *b)

{
  bool bVar1;
  int i;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  fld_t tmp;
  ulong local_38 [6];
  
  lVar2 = 0;
  do {
    local_38[lVar2] = a[lVar2] - b[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  fld_reduce((limb_t *)local_38,(limb_t *)local_38);
  lVar2 = 1;
  uVar3 = 0;
  do {
    local_38[0] = local_38[0] | local_38[lVar2];
    uVar3 = uVar3 | local_38[lVar2 + 1];
    lVar2 = lVar2 + 2;
  } while (lVar2 != 5);
  uVar3 = uVar3 | local_38[0];
  uVar4 = 0x20;
  do {
    uVar3 = (long)uVar3 >> (sbyte)uVar4 | uVar3;
    bVar1 = 1 < uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar1);
  return ~(uint)uVar3 & 1;
}

Assistant:

int
fld_eq(const fld_t a, const fld_t b)
{
	fld_t tmp;
	limb_t res;
	int i;

	/* tmp <- a - b */
	fld_sub(tmp, a, b);
	fld_reduce(tmp, tmp);

	/* and check tmp for zero */
	res = tmp[0];
	for (i = 1; i < FLD_LIMB_NUM; i++)
		res |= tmp[i];
	for (i = 4*sizeof(limb_t); i > 0; i >>= 1)
                res |= res >> i;

	/* now (res & 1) is zero iff tmp is zero */
	res = ~res & 1;

	return res;
}